

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O2

int yy_grammar(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int yythunkpos121;
  int iVar5;
  int yypos121;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  yy__(G);
  iVar4 = G->pos;
  iVar5 = G->thunkpos;
  iVar3 = yy_declaration(G);
  if (iVar3 == 0) {
    G->pos = iVar4;
    G->thunkpos = iVar5;
    iVar4 = yy_definition(G);
    if (iVar4 == 0) goto LAB_001024f6;
  }
  do {
    do {
      iVar4 = G->pos;
      iVar5 = G->thunkpos;
      iVar3 = yy_declaration(G);
    } while (iVar3 != 0);
    G->pos = iVar4;
    G->thunkpos = iVar5;
    iVar3 = yy_definition(G);
  } while (iVar3 != 0);
  G->pos = iVar4;
  G->thunkpos = iVar5;
  iVar3 = yymatchString(G,"%%");
  if (iVar3 == 0) {
    G->pos = iVar4;
    G->thunkpos = iVar5;
  }
  else {
    yyText(G,G->begin,G->end);
    G->begin = G->pos;
    do {
      iVar4 = G->pos;
      iVar5 = G->thunkpos;
      iVar3 = yymatchDot(G);
    } while (iVar3 != 0);
    G->pos = iVar4;
    G->thunkpos = iVar5;
    yyText(G,G->begin,G->end);
    G->end = G->pos;
    yyDo(G,yy_1_trailer,G->begin,G->pos,"yy_1_trailer");
    iVar4 = G->pos;
    iVar5 = G->thunkpos;
  }
  iVar3 = yymatchDot(G);
  G->pos = iVar4;
  G->thunkpos = iVar5;
  if (iVar3 == 0) {
    return 1;
  }
LAB_001024f6:
  G->pos = iVar1;
  G->thunkpos = iVar2;
  return 0;
}

Assistant:

YY_RULE(int) yy_grammar(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyprintfv((stderr, "%s\n", "grammar"));
  if (!yy__(G))  goto l116;

  {  int yypos119= G->pos, yythunkpos119= G->thunkpos;  if (!yy_declaration(G))  goto l120;
  goto l119;
  l120:;	  G->pos= yypos119; G->thunkpos= yythunkpos119;  if (!yy_definition(G))  goto l116;

  }
  l119:;	
  l117:;	
  {  int yypos118= G->pos, yythunkpos118= G->thunkpos;
  {  int yypos121= G->pos, yythunkpos121= G->thunkpos;  if (!yy_declaration(G))  goto l122;
  goto l121;
  l122:;	  G->pos= yypos121; G->thunkpos= yythunkpos121;  if (!yy_definition(G))  goto l118;

  }
  l121:;	  goto l117;
  l118:;	  G->pos= yypos118; G->thunkpos= yythunkpos118;
  }
  {  int yypos123= G->pos, yythunkpos123= G->thunkpos;  if (!yy_trailer(G))  goto l123;
  goto l124;
  l123:;	  G->pos= yypos123; G->thunkpos= yythunkpos123;
  }
  l124:;	  if (!yy_end_of_file(G))  goto l116;
  yyprintf((stderr, "  ok   grammar"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));

  return 1;
  l116:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "grammar"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}